

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O0

void printerror(int status)

{
  int status_local;
  
  if (status != 0) {
    ffrprt(_stderr,status);
    exit(status);
  }
  return;
}

Assistant:

void printerror( int status)
{
    /*****************************************************/
    /* Print out cfitsio error messages and exit program */
    /*****************************************************/


    if (status)
    {
       fits_report_error(stderr, status); /* print error report */

       exit( status );    /* terminate the program, returning error status */
    }
    return;
}